

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O2

string * __thiscall Fraction::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,Fraction *this)

{
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (this->denominator_ == 1) {
    std::__cxx11::to_string(__return_storage_ptr__,this->numerator_);
  }
  else {
    std::__cxx11::to_string(&local_38,this->numerator_);
    std::operator+(&local_b8,"\\frac{",&local_38);
    std::operator+(&local_98,&local_b8,"}");
    std::operator+(&local_78,&local_98,"{");
    std::__cxx11::to_string(&sStack_d8,this->denominator_);
    std::operator+(&local_58,&local_78,&sStack_d8);
    std::operator+(__return_storage_ptr__,&local_58,"}");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Fraction::ToLaTex() const {
  if (denominator_ == 1) {
    return std::to_string(numerator_);
  }
  return "\\frac{" + std::to_string(numerator_) + "}" +
      "{" + std::to_string(denominator_) + "}";
}